

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas.c
# Opt level: O2

doublereal Wnrm2_(integer *n,doublereal *x,integer *incx)

{
  int iVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  
  lVar3 = (long)*n;
  iVar1 = *incx;
  dVar7 = 0.0;
  lVar4 = 1;
  while( true ) {
    bVar2 = lVar4 <= lVar3;
    if (iVar1 < 0) {
      bVar2 = lVar3 <= lVar4;
    }
    if (!bVar2) break;
    dVar6 = x[lVar4 + -1];
    uVar5 = -(ulong)(-dVar6 <= dVar6);
    dVar6 = (double)(~uVar5 & (ulong)-dVar6 | (ulong)dVar6 & uVar5);
    uVar5 = -(ulong)(dVar6 <= dVar7);
    dVar7 = (double)(uVar5 & (ulong)dVar7 | ~uVar5 & (ulong)dVar6);
    lVar4 = lVar4 + iVar1;
  }
  dVar6 = 0.0;
  if ((dVar7 == 0.0) && (!NAN(dVar7))) {
    return dVar6;
  }
  lVar4 = 1;
  while( true ) {
    bVar2 = lVar4 <= lVar3;
    if (iVar1 < 0) {
      bVar2 = lVar3 <= lVar4;
    }
    if (!bVar2) break;
    dVar6 = dVar6 + (x[lVar4 + -1] / dVar7) * (x[lVar4 + -1] / dVar7);
    lVar4 = lVar4 + iVar1;
  }
  if (dVar6 < 0.0) {
    dVar6 = sqrt(dVar6);
  }
  else {
    dVar6 = SQRT(dVar6);
  }
  return dVar7 * dVar6;
}

Assistant:

doublereal dnrm2_(integer *n, doublereal *x, integer *incx)
{
    /* System generated locals */
    integer i__1, i__2;
    doublereal ret_val, d__1, d__2, d__3;

    /* Builtin functions */
    double sqrt(doublereal);

    /* Local variables */
    static integer i__;
    static doublereal scale;

/*     ********** */

/*     Function dnrm2 */

/*     Given a vector x of length n, this function calculates the */
/*     Euclidean norm of x with stride incx. */

/*     The function statement is */

/*       double precision function dnrm2(n,x,incx) */

/*     where */

/*       n is a positive integer input variable. */

/*       x is an input array of length n. */

/*       incx is a positive integer variable that specifies the */
/*         stride of the vector. */

/*     Subprograms called */

/*       FORTRAN-supplied ... abs, max, sqrt */

/*     MINPACK-2 Project. February 1991. */
/*     Argonne National Laboratory. */
/*     Brett M. Averick. */

/*     ********** */
    /* Parameter adjustments */
    --x;

    /* Function Body */
    ret_val = 0.;
    scale = 0.;
    i__1 = *n;
    i__2 = *incx;
    for (i__ = 1; i__2 < 0 ? i__ >= i__1 : i__ <= i__1; i__ += i__2) {
/* Computing MAX */
	d__2 = scale, d__3 = (d__1 = x[i__], abs(d__1));
	scale = max(d__2,d__3);
/* L10: */
    }
    if (scale == 0.) {
	return ret_val;
    }
    i__2 = *n;
    i__1 = *incx;
    for (i__ = 1; i__1 < 0 ? i__ >= i__2 : i__ <= i__2; i__ += i__1) {
/* Computing 2nd power */
	d__1 = x[i__] / scale;
	ret_val += d__1 * d__1;
/* L20: */
    }
    ret_val = scale * sqrt(ret_val);
    return ret_val;
}